

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

int get_limits(lua_State *L)

{
  lua_createtable(L,0,5);
  lua_pushinteger(L,0x20);
  lua_setfield(L,-2,"BITS_INT");
  lua_pushinteger(L,0xffffff);
  lua_setfield(L,-2,"MAXARG_Ax");
  lua_pushinteger(L,0xffff);
  lua_setfield(L,-2,"MAXARG_Bx");
  lua_pushinteger(L,0x8000);
  lua_setfield(L,-2,"MAXARG_sBx");
  lua_pushinteger(L,0x20);
  lua_setfield(L,-2,"BITS_INT");
  lua_pushinteger(L,0x32);
  lua_setfield(L,-2,"LFPF");
  lua_pushinteger(L,0x75);
  lua_setfield(L,-2,"NUM_OPCODES");
  return 1;
}

Assistant:

static int get_limits (lua_State *L) {
  lua_createtable(L, 0, 5);
  setnameval(L, "BITS_INT", LUAI_BITSINT);
  setnameval(L, "MAXARG_Ax", MAXARG_Ax);
  setnameval(L, "MAXARG_Bx", MAXARG_Bx);
  setnameval(L, "MAXARG_sBx", MAXARG_sBx);
  setnameval(L, "BITS_INT", LUAI_BITSINT);
  setnameval(L, "LFPF", LFIELDS_PER_FLUSH);
  setnameval(L, "NUM_OPCODES", NUM_OPCODES);
  return 1;
}